

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O1

void * sx__malloc_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                    void *user_data)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  uint8_t *aligned;
  size_t __size;
  ulong uVar4;
  void *__dest;
  void *in_stack_ffffffffffffffc8;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (8 < align) {
        ptr = (void *)((long)ptr - (ulong)*(uint *)((long)ptr + -4));
      }
      free(ptr);
    }
    ptr = (void *)0x0;
  }
  else if (ptr == (void *)0x0) {
    if (align < 9) {
      pvVar3 = malloc(size);
      return pvVar3;
    }
    uVar4 = 8;
    if (8 < (int)align) {
      uVar4 = (ulong)align;
    }
    __size = size + uVar4 + 4;
    if (__size == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = malloc(__size);
    }
    if (pvVar3 == (void *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xb0,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    uVar4 = (ulong)((int)uVar4 - 1);
    ptr = (void *)(~uVar4 & (long)pvVar3 + uVar4 + 4);
    *(int *)((long)ptr + -4) = (int)ptr - (int)pvVar3;
  }
  else {
    if (align < 9) {
      pvVar3 = realloc(ptr,size);
      return pvVar3;
    }
    uVar1 = *(uint *)((long)ptr + -4);
    uVar4 = 8;
    if (8 < (int)align) {
      uVar4 = (ulong)align;
    }
    pvVar3 = sx__malloc_cb((void *)((long)ptr - (ulong)uVar1),size + uVar4 + 4,0,file,func,line,
                           in_stack_ffffffffffffffc8);
    if (pvVar3 == (void *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xcd,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    uVar4 = (ulong)((int)uVar4 - 1);
    __dest = (void *)(~uVar4 & (long)pvVar3 + uVar4 + 4);
    if (__dest != ptr) {
      memmove(__dest,(void *)((ulong)uVar1 + (long)pvVar3),size);
      *(int *)((long)__dest + -4) = (int)__dest - (int)pvVar3;
      ptr = __dest;
    }
  }
  return ptr;
}

Assistant:

static void* sx__malloc_cb(void* ptr, size_t size, uint32_t align, const char* file,
                           const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    sx_unused(line);
    sx_unused(func);
    sx_unused(file);

    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                free(ptr);
                return NULL;
            }

#if SX_COMPILER_MSVC
            _aligned_free(ptr);
#else
            sx__aligned_free(&g_alloc_malloc, ptr, file, func, line);
#endif
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return malloc(size);

#if SX_COMPILER_MSVC
        return _aligned_malloc(size, align);
#else
        return sx__aligned_alloc(&g_alloc_malloc, size, align, file, func, line);
#endif
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return realloc(ptr, size);

#if SX_COMPILER_MSVC
        return _aligned_realloc(ptr, size, align);
#else
        return sx__aligned_realloc(&g_alloc_malloc, ptr, size, align, file, func, line);
#endif
    }
}